

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall TokenSequenceParser::parse(TokenSequenceParser *this,Parser *parser,int *result)

{
  TokenType TVar1;
  pointer pEVar2;
  _List_node_base *p_Var3;
  TokenType *pTVar4;
  char *pcVar5;
  bool bVar6;
  Token *this_00;
  size_t sVar7;
  Identifier *this_01;
  char *pcVar8;
  pointer pTVar9;
  pointer pEVar10;
  TokenType *pTVar11;
  string_view other;
  
  pEVar10 = (this->entries).
            super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->entries).
           super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar10 == pEVar2) {
LAB_00141128:
      return pEVar10 != pEVar2;
    }
    p_Var3 = (((parser->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
    pTVar9 = (pEVar10->values).
             super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar4 = (pEVar10->tokens).super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar11 = (pEVar10->tokens).super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                   _M_impl.super__Vector_impl_data._M_start; pTVar11 != pTVar4;
        pTVar11 = pTVar11 + 1) {
      TVar1 = *pTVar11;
      this_00 = Parser::nextToken(parser);
      if (this_00->type != TVar1) goto LAB_00141103;
      if (TVar1 == Integer) {
        if ((pTVar9 == (pEVar10->values).
                       super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish) ||
           (pcVar5 = (pTVar9->field_1).textValue, pcVar8 = (char *)Token::intValue(this_00),
           pcVar5 != pcVar8)) goto LAB_00141103;
LAB_001410f0:
        pTVar9 = pTVar9 + 1;
      }
      else if (TVar1 == Identifier) {
        if (pTVar9 != (pEVar10->values).
                      super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          pcVar5 = (pTVar9->field_1).textValue;
          sVar7 = strlen(pcVar5);
          this_01 = Token::identifierValue(this_00);
          other._M_str = pcVar5;
          other._M_len = sVar7;
          bVar6 = Identifier::operator!=(this_01,other);
          if (!bVar6) goto LAB_001410f0;
        }
        goto LAB_00141103;
      }
    }
    if (pTVar9 == (pEVar10->values).
                  super__Vector_base<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      *result = pEVar10->result;
      goto LAB_00141128;
    }
LAB_00141103:
    (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var3;
    pEVar10 = pEVar10 + 1;
  } while( true );
}

Assistant:

bool TokenSequenceParser::parse(Parser& parser, int& result)
{
	for (Entry& entry: entries)
	{
		TokenizerPosition pos = parser.getTokenizer()->getPosition();
		auto values = entry.values.begin();

		bool valid = true;
		for (TokenType type: entry.tokens)
		{
			// check of token type matches
			const Token& token = parser.nextToken();
			if (token.type != type)
			{
				valid = false;
				break;
			}

			// if necessary, check if the value of the token also matches
			if (type == TokenType::Identifier)
			{
				if (values == entry.values.end() || values->textValue != token.identifierValue())
				{
					valid = false;
					break;
				}
				
				values++;
			} else if (type == TokenType::Integer)
			{
				if (values == entry.values.end() || values->intValue != token.intValue())
				{
					valid = false;
					break;
				}
				
				values++;
			} 
		}

		if (valid && values == entry.values.end())
		{
			result = entry.result;
			return true;
		}

		parser.getTokenizer()->setPosition(pos);
	}

	return false;
}